

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

int bssl::anon_unknown_0::QUICMethodTest::SetWriteSecretCallback
              (SSL *ssl,ssl_encryption_level_t level,SSL_CIPHER *cipher,uint8_t *secret,
              size_t secret_len)

{
  uint8_t *cipher_00;
  ssl_encryption_level_t level_00;
  bool bVar1;
  MockQUICTransport *this;
  Span<const_unsigned_char> local_40;
  size_t local_30;
  size_t secret_len_local;
  uint8_t *secret_local;
  SSL_CIPHER *cipher_local;
  SSL *pSStack_10;
  ssl_encryption_level_t level_local;
  SSL *ssl_local;
  
  local_30 = secret_len;
  secret_len_local = (size_t)secret;
  secret_local = (uint8_t *)cipher;
  cipher_local._4_4_ = level;
  pSStack_10 = ssl;
  this = TransportFromSSL(ssl);
  level_00 = cipher_local._4_4_;
  cipher_00 = secret_local;
  Span<const_unsigned_char>::Span(&local_40,(uchar *)secret_len_local,local_30);
  bVar1 = MockQUICTransport::SetWriteSecret(this,level_00,(SSL_CIPHER *)cipher_00,local_40);
  return (int)bVar1;
}

Assistant:

static int SetWriteSecretCallback(SSL *ssl, ssl_encryption_level_t level,
                                    const SSL_CIPHER *cipher,
                                    const uint8_t *secret, size_t secret_len) {
    return TransportFromSSL(ssl)->SetWriteSecret(level, cipher,
                                                 Span(secret, secret_len));
  }